

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

int __thiscall
AbstractModuleClient::unsubscribeHighFreqData
          (AbstractModuleClient *this,string *dataName,string *originModule)

{
  bool bVar1;
  int iVar2;
  string sStack_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  HighFreqDataType local_148;
  HighFreqDataType local_b8;
  
  std::__cxx11::string::string((string *)&local_168,(string *)dataName);
  std::__cxx11::string::string((string *)&local_1c8,(string *)originModule);
  bVar1 = MlmWrap::isHfTypeCurrentlySubbed(&this->super_MlmWrap,&local_168,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_168);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_188,(string *)dataName);
    std::__cxx11::string::string((string *)&local_1e8,(string *)originModule);
    MlmWrap::getSubbedHfType(&local_b8,&this->super_MlmWrap,&local_188,&local_1e8);
    MlmWrap::removeSubFromList(&this->super_MlmWrap,&local_b8);
    HighFreqDataType::~HighFreqDataType(&local_b8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::string((string *)&local_1a8,(string *)dataName);
    std::__cxx11::string::string((string *)&sStack_208,(string *)originModule);
    MlmWrap::getSubbedHfType(&local_148,&this->super_MlmWrap,&local_1a8,&sStack_208);
    iVar2 = MlmWrap::removeHfTypeFromSubbedList(&this->super_MlmWrap,&local_148);
    HighFreqDataType::~HighFreqDataType(&local_148);
    std::__cxx11::string::~string((string *)&sStack_208);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int AbstractModuleClient::unsubscribeHighFreqData(std::string dataName, std::string originModule) {
//    std::cout << "mlmWrap: Unsubscribing from [" << dataName << "-" << originModule <<"]\n";
    int retval = -1;
    if (isHfTypeCurrentlySubbed(dataName, originModule)) {
        removeSubFromList(getSubbedHfType(dataName, originModule));
        retval = removeHfTypeFromSubbedList(getSubbedHfType(dataName, originModule));
    }
    return(retval);
}